

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O3

void __thiscall
duckdb::SQLLogicTestLogger::UnexpectedStatement
          (SQLLogicTestLogger *this,bool expect_ok,MaterializedQueryResult *result)

{
  char *pcVar1;
  undefined7 in_register_00000031;
  string local_40;
  
  pcVar1 = "Query unexpectedly succeeded!";
  if ((int)CONCAT71(in_register_00000031,expect_ok) != 0) {
    pcVar1 = "Query unexpectedly failed!";
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,pcVar1,pcVar1 + (ulong)!expect_ok * 3 + 0x1a);
  PrintErrorHeader(&this->file_name,(long)this->query_line,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  PrintLineSep();
  PrintSQL(this);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::UnexpectedStatement(bool expect_ok, MaterializedQueryResult &result) {
	PrintErrorHeader(!expect_ok ? "Query unexpectedly succeeded!" : "Query unexpectedly failed!");
	PrintLineSep();
	PrintSQL();
	PrintLineSep();
	result.Print();
}